

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char ** cargo_get_option_mutex_groups(cargo_t ctx,char *opt,size_t *count)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  size_t local_48;
  size_t opt_i;
  cargo_group_t *mgrp;
  cargo_opt_t *o;
  size_t i;
  size_t *count_local;
  char *opt_local;
  cargo_t ctx_local;
  
  mgrp = (cargo_group_t *)0x0;
  opt_i = 0;
  i = (size_t)count;
  count_local = (size_t *)opt;
  opt_local = (char *)ctx;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1b94,
                  "const char **cargo_get_option_mutex_groups(cargo_t, const char *, size_t *)");
  }
  if (opt != (char *)0x0) {
    if (count != (size_t *)0x0) {
      *count = 0;
    }
    iVar1 = _cargo_find_option_name(ctx,opt,&local_48,(size_t *)0x0);
    if (iVar1 == 0) {
      mgrp = (cargo_group_t *)(*(long *)(opt_local + 0x80) + local_48 * 0x128);
      if (mgrp[1].opt_count == 0) {
        pvVar2 = _cargo_calloc((size_t)mgrp[1].option_indices,8);
        mgrp[1].opt_count = (size_t)pvVar2;
        if (pvVar2 == (void *)0x0) {
          ctx_local = (cargo_t)0x0;
        }
        else {
          for (o = (cargo_opt_t *)0x0; o < (cargo_opt_t *)mgrp[1].option_indices;
              o = (cargo_opt_t *)((long)o->name + 1)) {
            opt_i = *(long *)(opt_local + 0x68) + (long)(&mgrp[1].title)[(long)o] * 0x48;
            pcVar3 = _cargo_strdup(*(char **)opt_i);
            *(char **)(mgrp[1].opt_count + (long)o * 8) = pcVar3;
          }
          if (i != 0) {
            *(size_t **)i = mgrp[1].option_indices;
          }
          if (mgrp[1].option_indices == (size_t *)0x0) {
            ctx_local = (cargo_t)0x0;
          }
          else {
            ctx_local = (cargo_t)mgrp[1].opt_count;
          }
        }
      }
      else {
        if (i != 0) {
          *(size_t **)i = mgrp[1].option_indices;
        }
        ctx_local = (cargo_t)mgrp[1].opt_count;
      }
    }
    else {
      ctx_local = (cargo_t)0x0;
    }
    return &ctx_local->progname;
  }
  __assert_fail("opt",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x1b95,"const char **cargo_get_option_mutex_groups(cargo_t, const char *, size_t *)"
               );
}

Assistant:

const char **cargo_get_option_mutex_groups(cargo_t ctx,
                                            const char *opt, size_t *count)
{
    size_t i;
    cargo_opt_t *o = NULL;
    cargo_group_t *mgrp = NULL;
    size_t opt_i;
    assert(ctx);
    assert(opt);

    if (count) *count = 0;

    if (_cargo_find_option_name(ctx, opt, &opt_i, NULL))
    {
        CARGODBG(1, "No such option \"%s\"\n", opt);
        return NULL;
    }

    o = &ctx->options[opt_i];

    // Use cached version. Mutex group count should
    // not be changed between calls anyway.
    if (o->mutex_group_names)
    {
        if (count) *count = o->mutex_group_count;
        return (const char **)o->mutex_group_names;
    }

    if (!(o->mutex_group_names = _cargo_calloc(o->mutex_group_count, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory\n");
        return NULL;
    }

    for (i = 0; i < o->mutex_group_count; i++)
    {
        mgrp = &ctx->mutex_groups[o->mutex_group_idxs[i]];
        o->mutex_group_names[i] = _cargo_strdup(mgrp->name);
    }

    if (count) *count = o->mutex_group_count;

    if (o->mutex_group_count == 0)
    {
        return NULL;
    }

    return (const char **)o->mutex_group_names;
}